

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

uint8_t get_sprite_pixel(uint8_t *spr_pal,_Bool *spr_behind_bg,_Bool *spr_is_s0,uint16_t dot)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  bool local_32;
  byte local_2d;
  uint8_t pat_res;
  uint16_t offset;
  uint8_t i;
  uint16_t pixel;
  uint16_t dot_local;
  _Bool *spr_is_s0_local;
  _Bool *spr_behind_bg_local;
  uint8_t *spr_pal_local;
  
  local_2d = 0;
  while( true ) {
    if (7 < local_2d) {
      return '\0';
    }
    uVar3 = (dot - 1) - (ushort)sprite_x[local_2d];
    if ((uVar3 < 8) &&
       (cVar1 = (char)uVar3,
       bVar2 = (byte)(((int)(uint)sprite_high_pattern[local_2d] >> (7U - cVar1 & 0x1f) & 1U) << 1) |
               (byte)((int)(uint)sprite_low_pattern[local_2d] >> (7U - cVar1 & 0x1f)) & 1,
       bVar2 != 0)) break;
    local_2d = local_2d + 1;
  }
  *spr_pal = sprite_attributes[local_2d] & 3;
  *spr_behind_bg = (sprite_attributes[local_2d] & 0x20) != 0;
  local_32 = (sprite0_on_current_scanline & 1U) != 0 && local_2d == 0;
  *spr_is_s0 = local_32;
  return bVar2;
}

Assistant:

uint8_t get_sprite_pixel(uint8_t* spr_pal, bool* spr_behind_bg, bool* spr_is_s0, uint16_t dot) {
    uint16_t const pixel = dot - 1;

    for (uint8_t i = 0; i < 8; ++i) {
        uint16_t const offset = pixel - sprite_x[i];
        if (offset < 8) {
            uint8_t pat_res = (NTH_BIT(sprite_high_pattern[i], 7 - offset) << 1) |
                               NTH_BIT(sprite_low_pattern[i], 7 - offset);
            if (pat_res) {
                *spr_pal       = sprite_attributes[i] & 3;
                *spr_behind_bg = sprite_attributes[i] & 0x20;
                *spr_is_s0     = sprite0_on_current_scanline && (i == 0);
                return pat_res;
            }
        }
    }
    return 0;
}